

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void check_trap(wasm_func_t *func,int32_t arg1,int32_t arg2)

{
  long lVar1;
  wasm_val_t args [2];
  
  args[0].kind = '\0';
  args[1].kind = '\0';
  args[0].of._0_4_ = arg1;
  args[1].of._0_4_ = arg2;
  lVar1 = wasm_func_call(func,args,0);
  if (lVar1 != 0) {
    wasm_trap_delete(lVar1);
    return;
  }
  puts("> Error on result, expected trap");
  exit(1);
}

Assistant:

void check_trap(wasm_func_t* func, int32_t arg1, int32_t arg2) {
  wasm_val_t args[2] = {
    {.kind = WASM_I32, .of = {.i32 = arg1}},
    {.kind = WASM_I32, .of = {.i32 = arg2}}
  };
  own wasm_trap_t* trap = wasm_func_call(func, args, NULL);
  if (! trap) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(trap);
}